

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::FixedValuesGenerator<std::tuple<float,_float,_float>_>::FixedValuesGenerator
          (FixedValuesGenerator<std::tuple<float,_float,_float>_> *this,
          initializer_list<std::tuple<float,_float,_float>_> values)

{
  initializer_list<std::tuple<float,_float,_float>_> __l;
  allocator<std::tuple<float,_float,_float>_> local_39;
  FixedValuesGenerator<std::tuple<float,_float,_float>_> *local_38;
  iterator ptStack_30;
  FixedValuesGenerator<std::tuple<float,_float,_float>_> *local_20;
  FixedValuesGenerator<std::tuple<float,_float,_float>_> *this_local;
  initializer_list<std::tuple<float,_float,_float>_> values_local;
  
  values_local._M_array = (iterator)values._M_len;
  this_local = (FixedValuesGenerator<std::tuple<float,_float,_float>_> *)values._M_array;
  local_20 = this;
  IGenerator<std::tuple<float,_float,_float>_>::IGenerator
            (&this->super_IGenerator<std::tuple<float,_float,_float>_>);
  (this->super_IGenerator<std::tuple<float,_float,_float>_>).super_GeneratorUntypedBase.
  _vptr_GeneratorUntypedBase = (_func_int **)&PTR_next_007be4d8;
  local_38 = this_local;
  ptStack_30 = values_local._M_array;
  std::allocator<std::tuple<float,_float,_float>_>::allocator(&local_39);
  __l._M_len = (size_type)ptStack_30;
  __l._M_array = (iterator)local_38;
  std::vector<std::tuple<float,_float,_float>,_std::allocator<std::tuple<float,_float,_float>_>_>::
  vector(&this->m_values,__l,&local_39);
  std::allocator<std::tuple<float,_float,_float>_>::~allocator(&local_39);
  this->m_idx = 0;
  return;
}

Assistant:

FixedValuesGenerator( std::initializer_list<T> values ) : m_values( values ) {}